

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialiseEkk(HEkk *this)

{
  HEkk *in_RDI;
  BadBasisChangeReason in_stack_0000003c;
  HEkk *in_stack_00000040;
  HEkk *in_stack_00000050;
  
  if (((in_RDI->status_).initialised_for_new_lp & 1U) == 0) {
    setSimplexOptions(in_RDI);
    initialiseControl(in_RDI);
    initialiseSimplexLpRandomVectors(in_stack_00000050);
    HSimplexNla::clear(&in_RDI->simplex_nla_);
    clearBadBasisChange(in_stack_00000040,in_stack_0000003c);
    (in_RDI->status_).initialised_for_new_lp = true;
  }
  return;
}

Assistant:

void HEkk::initialiseEkk() {
  if (status_.initialised_for_new_lp) return;
  setSimplexOptions();
  initialiseControl();
  initialiseSimplexLpRandomVectors();
  simplex_nla_.clear();
  clearBadBasisChange();
  status_.initialised_for_new_lp = true;
}